

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

int ikcp_send(ikcpcb *kcp,char *buffer,int len)

{
  uint uVar1;
  IQUEUEHEAD *pIVar2;
  IUINT32 IVar3;
  IQUEUEHEAD *pIVar4;
  IQUEUEHEAD *pIVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  
  uVar1 = kcp->mss;
  if (uVar1 == 0) {
    __assert_fail("kcp->mss > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x1da,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  if (-1 < len) {
    if (kcp->stream != 0) {
      if (&kcp->snd_queue != (kcp->snd_queue).next) {
        pIVar5 = (kcp->snd_queue).prev;
        uVar8 = *(uint *)((long)&pIVar5[2].prev + 4);
        iVar7 = uVar1 - uVar8;
        if (uVar8 <= uVar1 && iVar7 != 0) {
          if (len <= iVar7) {
            iVar7 = len;
          }
          sVar9 = (long)(int)(uVar8 + iVar7) + 0x48;
          if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
            pIVar4 = (IQUEUEHEAD *)malloc(sVar9);
          }
          else {
            pIVar4 = (IQUEUEHEAD *)(*ikcp_malloc_hook)(sVar9);
          }
          if (pIVar4 == (IQUEUEHEAD *)0x0) {
            __assert_fail("seg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                          ,0x1e5,"int ikcp_send(ikcpcb *, const char *, int)");
          }
          pIVar2 = (kcp->snd_queue).prev;
          pIVar4->prev = pIVar2;
          pIVar4->next = &kcp->snd_queue;
          pIVar2->next = pIVar4;
          (kcp->snd_queue).prev = pIVar4;
          memcpy(pIVar4 + 4,pIVar5 + 4,(ulong)*(uint *)((long)&pIVar5[2].prev + 4));
          if (buffer == (char *)0x0) {
            buffer = (char *)0x0;
          }
          else {
            memcpy((void *)((long)&pIVar4[4].next + (ulong)*(uint *)((long)&pIVar5[2].prev + 4)),
                   buffer,(long)iVar7);
            buffer = buffer + iVar7;
          }
          *(int *)((long)&pIVar4[2].prev + 4) = *(int *)((long)&pIVar5[2].prev + 4) + iVar7;
          *(undefined4 *)&pIVar4[1].prev = 0;
          pIVar4 = pIVar5->next;
          pIVar4->prev = pIVar5->prev;
          pIVar5->prev->next = pIVar4;
          pIVar5->next = (IQUEUEHEAD *)0x0;
          pIVar5->prev = (IQUEUEHEAD *)0x0;
          pIVar5->next = pIVar5;
          pIVar5->prev = pIVar5;
          if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
            free(pIVar5);
          }
          else {
            (*ikcp_free_hook)(pIVar5);
          }
          len = len - iVar7;
        }
      }
      if (len < 1) {
        return 0;
      }
    }
    uVar1 = kcp->mss;
    uVar8 = 1;
    if ((int)uVar1 < len) {
      uVar8 = ((len + uVar1) - 1) / uVar1;
    }
    if (0x7f < (int)uVar8) {
      return -2;
    }
    iVar7 = uVar8 + (uVar8 == 0);
    if (iVar7 < 1) {
      return 0;
    }
    while( true ) {
      iVar7 = iVar7 + -1;
      IVar3 = kcp->mss;
      if (len < (int)kcp->mss) {
        IVar3 = len;
      }
      sVar9 = (size_t)(int)IVar3;
      if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
        pIVar5 = (IQUEUEHEAD *)malloc(sVar9 + 0x48);
      }
      else {
        pIVar5 = (IQUEUEHEAD *)(*ikcp_malloc_hook)(sVar9 + 0x48);
      }
      if (pIVar5 == (IQUEUEHEAD *)0x0) break;
      if ((buffer != (char *)0x0) && (0 < len)) {
        memcpy(pIVar5 + 4,buffer,sVar9);
      }
      *(IUINT32 *)((long)&pIVar5[2].prev + 4) = IVar3;
      iVar6 = 0;
      if (kcp->stream == 0) {
        iVar6 = iVar7;
      }
      *(int *)&pIVar5[1].prev = iVar6;
      pIVar5->next = pIVar5;
      pIVar5->prev = pIVar5;
      pIVar4 = (kcp->snd_queue).prev;
      pIVar5->prev = pIVar4;
      pIVar5->next = &kcp->snd_queue;
      pIVar4->next = pIVar5;
      kcp->nsnd_que = kcp->nsnd_que + 1;
      (kcp->snd_queue).prev = pIVar5;
      if (buffer != (char *)0x0) {
        buffer = buffer + sVar9;
      }
      len = len - IVar3;
      if (iVar7 == 0) {
        return 0;
      }
    }
    __assert_fail("seg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x206,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  return -1;
}

Assistant:

int ikcp_send(ikcpcb *kcp, const char *buffer, int len)
{
	IKCPSEG *seg;
	int count, i;

	assert(kcp->mss > 0);
	if (len < 0) return -1;

	// append to previous segment in streaming mode (if possible)
	if (kcp->stream != 0) {
		if (!iqueue_is_empty(&kcp->snd_queue)) {
			IKCPSEG *old = iqueue_entry(kcp->snd_queue.prev, IKCPSEG, node);
			if (old->len < kcp->mss) {
				int capacity = kcp->mss - old->len;
				int extend = (len < capacity)? len : capacity;
				seg = ikcp_segment_new(kcp, old->len + extend);
				assert(seg);
				if (seg == NULL) {
					return -2;
				}
				iqueue_add_tail(&seg->node, &kcp->snd_queue);
				memcpy(seg->data, old->data, old->len);
				if (buffer) {
					memcpy(seg->data + old->len, buffer, extend);
					buffer += extend;
				}
				seg->len = old->len + extend;
				seg->frg = 0;
				len -= extend;
				iqueue_del_init(&old->node);
				ikcp_segment_delete(kcp, old);
			}
		}
		if (len <= 0) {
			return 0;
		}
	}

	if (len <= (int)kcp->mss) count = 1;
	else count = (len + kcp->mss - 1) / kcp->mss;

	if (count >= (int)IKCP_WND_RCV) return -2;

	if (count == 0) count = 1;

	// fragment
	for (i = 0; i < count; i++) {
		int size = len > (int)kcp->mss ? (int)kcp->mss : len;
		seg = ikcp_segment_new(kcp, size);
		assert(seg);
		if (seg == NULL) {
			return -2;
		}
		if (buffer && len > 0) {
			memcpy(seg->data, buffer, size);
		}
		seg->len = size;
		seg->frg = (kcp->stream == 0)? (count - i - 1) : 0;
		iqueue_init(&seg->node);
		iqueue_add_tail(&seg->node, &kcp->snd_queue);
		kcp->nsnd_que++;
		if (buffer) {
			buffer += size;
		}
		len -= size;
	}

	return 0;
}